

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_hex4.c
# Opt level: O3

void parse_hex4_should_parse_all_combinations(void)

{
  int iVar1;
  uint uVar2;
  ulong expected;
  long in_FS_OFFSET;
  uchar digits_upper [6];
  uchar digits_lower [6];
  uchar local_44 [6];
  uchar local_3e [6];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  expected = 0;
  do {
    iVar1 = sprintf((char *)local_3e,"%.4x",expected & 0xffffffff);
    UnityAssertEqualNumber(4,(long)iVar1,"sprintf failed.",0x27,UNITY_DISPLAY_STYLE_INT);
    iVar1 = sprintf((char *)local_44,"%.4X",expected & 0xffffffff);
    UnityAssertEqualNumber(4,(long)iVar1,"sprintf failed.",0x28,UNITY_DISPLAY_STYLE_INT);
    uVar2 = parse_hex4(local_3e);
    UnityAssertEqualNumber
              (expected,(ulong)uVar2,"Failed to parse lowercase digits.",0x2a,
               UNITY_DISPLAY_STYLE_INT);
    uVar2 = parse_hex4(local_44);
    UnityAssertEqualNumber
              (expected,(ulong)uVar2,"Failed to parse uppercase digits.",0x2b,
               UNITY_DISPLAY_STYLE_INT);
    expected = expected + 1;
  } while (expected != 0x10000);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_hex4_should_parse_all_combinations(void)
{
    unsigned int number = 0;
    unsigned char digits_lower[6];
    unsigned char digits_upper[6];
    /* test all combinations */
    for (number = 0; number <= 0xFFFF; number++)
    {
        TEST_ASSERT_EQUAL_INT_MESSAGE(4, sprintf((char*)digits_lower, "%.4x", number), "sprintf failed.");
        TEST_ASSERT_EQUAL_INT_MESSAGE(4, sprintf((char*)digits_upper, "%.4X", number), "sprintf failed.");

        TEST_ASSERT_EQUAL_INT_MESSAGE(number, parse_hex4(digits_lower), "Failed to parse lowercase digits.");
        TEST_ASSERT_EQUAL_INT_MESSAGE(number, parse_hex4(digits_upper), "Failed to parse uppercase digits.");
    }
}